

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  size_t __n;
  RGBColorSpace *pRVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long *plVar7;
  const_iterator cVar8;
  RGBSpectrum *this_00;
  ulong uVar9;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar10;
  long *in_R8;
  long lVar11;
  pointer pcVar12;
  SpectrumHandle s;
  RGB local_48;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_38;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_00000014,spectrumType);
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar12 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar12 = *(pointer *)(pcVar1 + 8);
  }
  if (lVar2 != 0) {
    lVar11 = 0;
    do {
      pcVar3 = *(char **)(pcVar12 + lVar11);
      __n = *(size_t *)(pcVar3 + 0x28);
      if ((__n == args->_M_string_length) &&
         ((args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pcVar3 + 0x20), __n == 0 ||
          (iVar6 = bcmp((args_1->_M_dataplus)._M_p,(args->_M_dataplus)._M_p,__n), iVar6 == 0)))) {
        iVar6 = std::__cxx11::string::compare(pcVar3);
        if (iVar6 == 0) {
          if (*(long *)(pcVar3 + 0x90) != 1) {
            if (*(long *)(pcVar3 + 0x90) == 0) {
              pcVar10 = "No texture name provided for parameter \"%s\".";
            }
            else {
              pcVar10 = "More than one texture name provided for parameter \"%s\".";
            }
            ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),pcVar10,args);
          }
          pcVar3[0xb8] = '\x01';
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                          *)(name->field_2)._M_allocated_capacity,*(key_type **)(pcVar3 + 0x80));
          if (cVar8._M_node != (_Base_ptr)((name->field_2)._M_allocated_capacity + 8)) {
            this->dict = *(ParameterDictionary **)(cVar8._M_node + 2);
            return (SpectrumTextureHandle)this;
          }
          ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((FileLoc *)(pcVar3 + 0x40),
                     "Couldn\'t find spectrum texture named \"%s\" for parameter \"%s\"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pcVar3 + 0x80),args_1);
        }
        iVar6 = std::__cxx11::string::compare(pcVar3);
        if (iVar6 == 0) {
          if (*(long *)(pcVar3 + 0x70) == 3) {
            pcVar3[0xb8] = '\x01';
            local_48.b = (Float)*(double *)(*(undefined1 (**) [16])(pcVar3 + 0x60))[1];
            auVar5 = vcvtpd2ps_avx(**(undefined1 (**) [16])(pcVar3 + 0x60));
            local_48._0_8_ = vmovlps_avx(auVar5);
            if (((0.0 <= auVar5._0_4_) && (auVar5 = vmovshdup_avx(auVar5), 0.0 <= auVar5._0_4_)) &&
               (0.0 <= local_48.b)) {
              if ((int)alloc.memoryResource == 0) {
                pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
                this_00 = (RGBSpectrum *)(**(code **)(*in_R8 + 0x10))(in_R8,0x1c,4);
                RGBReflectanceSpectrum::RGBReflectanceSpectrum
                          ((RGBReflectanceSpectrum *)this_00,pRVar4,&local_48);
                uVar9 = 0x2000000000000;
              }
              else {
                if ((int)alloc.memoryResource != 1) {
                  LogFatal<char_const(&)[42]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                             ,0x349,"Check failed: %s",
                             (char (*) [42])"spectrumType == SpectrumType::Reflectance");
                }
                pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
                this_00 = (RGBSpectrum *)(**(code **)(*in_R8 + 0x10))(in_R8,0x28,8);
                RGBSpectrum::RGBSpectrum(this_00,pRVar4,&local_48);
                uVar9 = 0x1000000000000;
              }
              this->dict = (ParameterDictionary *)((ulong)this_00 | uVar9);
              return (SpectrumTextureHandle)this;
            }
            pcVar10 = "Negative value provided for \"rgb\" parameter \"%s\".";
          }
          else {
            pcVar10 = "Didn\'t find three values for \"rgb\" parameter \"%s\".";
          }
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),pcVar10,args_1);
        }
        iVar6 = std::__cxx11::string::compare(pcVar3);
        if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare(pcVar3), iVar6 == 0)) {
          local_48.r = 0.0;
          local_48.g = 0.0;
          ParameterDictionary::GetOneSpectrum
                    ((ParameterDictionary *)&stack0xffffffffffffffc8,
                     (string *)(name->_M_dataplus)._M_p,(SpectrumHandle *)args,
                     (SpectrumType)&local_48,
                     (memory_resource *)((ulong)alloc.memoryResource & 0xffffffff));
          if (local_38.memoryResource != (memory_resource *)0x0) {
            plVar7 = (long *)(**(code **)(*in_R8 + 0x10))(in_R8,8,8);
            *plVar7 = (long)local_38.memoryResource;
            this->dict = (ParameterDictionary *)((ulong)plVar7 | 0x7000000000000);
            return (SpectrumTextureHandle)this;
          }
          LogFatal<char_const(&)[13]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                     ,0x34f,"Check failed: %s",(char (*) [13])0x61fc3c);
        }
      }
      lVar11 = lVar11 + 8;
    } while (lVar2 << 3 != lVar11);
  }
  this->dict = (ParameterDictionary *)0x0;
  return (SpectrumTextureHandle)this;
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTextureOrNull(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures->find(p->strings[0]);
            if (iter != spectrumTextures->end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->numbers.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->numbers[0], p->numbers[1], p->numbers[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc,
                          "Negative value provided for \"rgb\" parameter \"%s\".",
                          p->name);
            if (spectrumType == SpectrumType::General)
                return alloc.new_object<RGBConstantTexture>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Reflectance);
                return alloc.new_object<RGBReflectanceConstantTexture>(
                    *dict->ColorSpace(), rgb);
            }
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            SpectrumHandle s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s != nullptr);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}